

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * testing::internal::edit_distance::CreateUnifiedDiff
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *left,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *right,size_t context)

{
  EditType EVar1;
  _List_node_base *p_Var2;
  char *__s;
  undefined8 *puVar3;
  string *psVar4;
  ulong uVar5;
  _List_node_base *p_Var6;
  ostream *poVar7;
  size_t sVar8;
  ulong uVar9;
  pointer pEVar10;
  size_t i;
  char edit;
  size_t sVar11;
  size_t sVar12;
  size_t *psVar13;
  long lVar14;
  undefined8 *puVar15;
  size_t *psVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  stringstream local_270 [8];
  stringstream ss;
  ostream local_260 [112];
  ios_base local_1f0 [264];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e8;
  string *local_e0;
  undefined1 local_d8 [8];
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  edits;
  undefined1 local_b8 [8];
  Hunk hunk;
  char local_32;
  char local_31;
  
  local_e8 = right;
  local_e0 = __return_storage_ptr__;
  edits.
  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)left;
  CalculateOptimalEdits
            ((vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
              *)local_d8,left,right);
  std::__cxx11::stringstream::stringstream(local_270);
  uVar20 = 0;
  uVar18 = 0;
  sVar12 = 0;
  do {
    psVar16 = &hunk.hunk_.
               super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
               ._M_impl._M_node._M_size;
    psVar13 = &hunk.common_;
    uVar5 = (long)edits.
                  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                  ._M_impl.super__Vector_impl_data._M_start - (long)local_d8 >> 2;
    if (uVar5 <= uVar18) break;
    uVar9 = (uVar20 + uVar5) - uVar18;
    sVar11 = (sVar12 + uVar5) - uVar18;
    uVar17 = uVar18;
    uVar19 = uVar20;
    do {
      hunk.hunk_removes_.
      super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
      ._M_impl._M_node._M_size = sVar12;
      uVar18 = uVar17;
      uVar20 = uVar19;
      if (*(pointer)((long)local_d8 + uVar17 * 4) != kMatch) break;
      uVar19 = uVar19 + 1;
      sVar12 = sVar12 + 1;
      uVar17 = uVar17 + 1;
      hunk.hunk_removes_.
      super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
      ._M_impl._M_node._M_size = sVar11;
      uVar18 = uVar5;
      uVar20 = uVar9;
    } while (uVar5 != uVar17);
    sVar12 = context;
    if (uVar20 < context) {
      sVar12 = uVar20;
    }
    local_b8 = (undefined1  [8])((uVar20 - sVar12) + 1);
    hunk.left_start_ =
         (hunk.hunk_removes_.
          super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
          ._M_impl._M_node._M_size - sVar12) + 1;
    hunk.removes_ = 0;
    hunk.right_start_ = 0;
    hunk.adds_ = 0;
    hunk.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    hunk.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    hunk.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size =
         (size_t)&hunk.hunk_adds_.
                  super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                  ._M_impl._M_node._M_size;
    hunk.hunk_removes_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    hunk.common_ = (size_t)psVar13;
    hunk.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)psVar13;
    hunk.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size = (size_t)psVar16;
    hunk.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)psVar16;
    hunk.hunk_removes_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next =
         (_List_node_base *)
         hunk.hunk_adds_.
         super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
         ._M_impl._M_node._M_size;
    if (sVar12 != 0) {
      lVar14 = uVar20 * 0x20 + sVar12 * -0x20;
      do {
        anon_unknown_1::Hunk::PushLine
                  ((Hunk *)local_b8,' ',
                   *(char **)(*(undefined8 *)
                               edits.
                               super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar14));
        lVar14 = lVar14 + 0x20;
        sVar12 = sVar12 - 1;
      } while (sVar12 != 0);
    }
    if (uVar18 < (ulong)((long)edits.
                               super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                               ._M_impl.super__Vector_impl_data._M_start - (long)local_d8 >> 2)) {
      uVar5 = 0;
      do {
        if (context <= uVar5) {
          for (pEVar10 = (pointer)((long)local_d8 + (long)(int)uVar18 * 4);
              (pEVar10 !=
               edits.
               super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
               ._M_impl.super__Vector_impl_data._M_start && (*pEVar10 == kMatch));
              pEVar10 = pEVar10 + 1) {
          }
          if ((pEVar10 ==
               edits.
               super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
               ._M_impl.super__Vector_impl_data._M_start) ||
             (context <= ((long)pEVar10 - (long)local_d8 >> 2) - uVar18)) break;
        }
        EVar1 = *(pointer)((long)local_d8 + uVar18 * 4);
        uVar5 = uVar5 + 1;
        if (EVar1 != kMatch) {
          uVar5 = 0;
        }
        if ((EVar1 < 4) && (EVar1 != kAdd)) {
          edit = '-';
          if (EVar1 == kMatch) {
            edit = ' ';
          }
          anon_unknown_1::Hunk::PushLine
                    ((Hunk *)local_b8,edit,
                     *(char **)(*(undefined8 *)
                                 edits.
                                 super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + uVar20 * 0x20)
                    );
        }
        if ((EVar1 & ~kRemove) == kAdd) {
          p_Var2 = (_List_node_base *)
                   (local_e8->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start
                   [hunk.hunk_removes_.
                    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                    ._M_impl._M_node._M_size]._M_dataplus._M_p;
          hunk.right_start_ = hunk.right_start_ + 1;
          p_Var6 = (_List_node_base *)operator_new(0x20);
          *(undefined1 *)&p_Var6[1]._M_next = 0x2b;
          p_Var6[1]._M_prev = p_Var2;
          std::__detail::_List_node_base::_M_hook(p_Var6);
          hunk.hunk_adds_.
          super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
          ._M_impl._M_node.super__List_node_base._M_prev =
               (_List_node_base *)
               ((long)&(hunk.hunk_adds_.
                        super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                        ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1);
        }
        uVar20 = uVar20 + (EVar1 != kAdd);
        hunk.hunk_removes_.
        super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
        ._M_impl._M_node._M_size =
             hunk.hunk_removes_.
             super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
             ._M_impl._M_node._M_size + (EVar1 != kRemove);
        uVar18 = uVar18 + 1;
      } while (uVar18 < (ulong)((long)edits.
                                      super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                      ._M_impl.super__Vector_impl_data._M_start - (long)local_d8 >>
                               2));
    }
    local_31 = hunk.adds_ != 0 || hunk.right_start_ != 0;
    if (hunk.adds_ != 0 || hunk.right_start_ != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_260,"@@ ",3);
      if (hunk.adds_ != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_260,"-",1);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_260);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      }
      if ((hunk.adds_ != 0) && (hunk.right_start_ != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>(local_260," ",1);
      }
      if (hunk.right_start_ != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_260,"+",1);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_260);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_260," @@\n",4);
      anon_unknown_1::Hunk::FlushEdits((Hunk *)local_b8);
      for (puVar15 = (undefined8 *)hunk.common_; puVar15 != &hunk.common_;
          puVar15 = (undefined8 *)*puVar15) {
        local_32 = *(char *)(puVar15 + 2);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>(local_260,&local_32,1);
        __s = (char *)puVar15[3];
        if (__s == (char *)0x0) {
          std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
        }
        else {
          sVar8 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,__s,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      }
    }
    puVar15 = (undefined8 *)
              hunk.hunk_adds_.
              super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
              ._M_impl._M_node._M_size;
    while (puVar15 !=
           &hunk.hunk_adds_.
            super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
            ._M_impl._M_node._M_size) {
      puVar3 = (undefined8 *)*puVar15;
      operator_delete(puVar15);
      puVar15 = puVar3;
    }
    puVar15 = (undefined8 *)
              hunk.hunk_.
              super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
              ._M_impl._M_node._M_size;
    while (sVar12 = hunk.hunk_removes_.
                    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                    ._M_impl._M_node._M_size, puVar3 = (undefined8 *)hunk.common_,
          puVar15 !=
          &hunk.hunk_.
           super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
           ._M_impl._M_node._M_size) {
      puVar3 = (undefined8 *)*puVar15;
      operator_delete(puVar15);
      puVar15 = puVar3;
    }
    while (hunk.hunk_removes_.
           super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
           ._M_impl._M_node._M_size = sVar12, puVar3 != &hunk.common_) {
      puVar15 = (undefined8 *)*puVar3;
      operator_delete(puVar3);
      sVar12 = hunk.hunk_removes_.
               super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
               ._M_impl._M_node._M_size;
      puVar3 = puVar15;
    }
  } while (local_31 != '\0');
  psVar4 = local_e0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_270);
  std::ios_base::~ios_base(local_1f0);
  if (local_d8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_d8);
  }
  return psVar4;
}

Assistant:

std::string CreateUnifiedDiff(const std::vector<std::string>& left,
                              const std::vector<std::string>& right,
                              size_t context) {
  const std::vector<EditType> edits = CalculateOptimalEdits(left, right);

  size_t l_i = 0, r_i = 0, edit_i = 0;
  std::stringstream ss;
  while (edit_i < edits.size()) {
    // Find first edit.
    while (edit_i < edits.size() && edits[edit_i] == kMatch) {
      ++l_i;
      ++r_i;
      ++edit_i;
    }

    // Find the first line to include in the hunk.
    const size_t prefix_context = std::min(l_i, context);
    Hunk hunk(l_i - prefix_context + 1, r_i - prefix_context + 1);
    for (size_t i = prefix_context; i > 0; --i) {
      hunk.PushLine(' ', left[l_i - i].c_str());
    }

    // Iterate the edits until we found enough suffix for the hunk or the input
    // is over.
    size_t n_suffix = 0;
    for (; edit_i < edits.size(); ++edit_i) {
      if (n_suffix >= context) {
        // Continue only if the next hunk is very close.
        auto it = edits.begin() + static_cast<int>(edit_i);
        while (it != edits.end() && *it == kMatch) ++it;
        if (it == edits.end() ||
            static_cast<size_t>(it - edits.begin()) - edit_i >= context) {
          // There is no next edit or it is too far away.
          break;
        }
      }

      EditType edit = edits[edit_i];
      // Reset count when a non match is found.
      n_suffix = edit == kMatch ? n_suffix + 1 : 0;

      if (edit == kMatch || edit == kRemove || edit == kReplace) {
        hunk.PushLine(edit == kMatch ? ' ' : '-', left[l_i].c_str());
      }
      if (edit == kAdd || edit == kReplace) {
        hunk.PushLine('+', right[r_i].c_str());
      }

      // Advance indices, depending on edit type.
      l_i += edit != kAdd;
      r_i += edit != kRemove;
    }

    if (!hunk.has_edits()) {
      // We are done. We don't want this hunk.
      break;
    }

    hunk.PrintTo(&ss);
  }
  return ss.str();
}